

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadSpecs(CrateReader *this)

{
  vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_> *this_00;
  pointer *ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pSVar4;
  StreamReader *pSVar5;
  uint64_t uVar6;
  bool bVar7;
  ostream *poVar8;
  long *plVar9;
  ulong uVar10;
  undefined8 *puVar11;
  size_t __new_size;
  size_t sVar12;
  long *plVar13;
  ulong *puVar14;
  long lVar15;
  pointer pSVar16;
  Index *pIVar17;
  SpecType *pSVar18;
  int iVar19;
  char *pcVar20;
  pointer puVar21;
  size_t nbytes;
  pointer *ppuVar22;
  uint uVar23;
  string err;
  string __str_1;
  vector<char,_std::allocator<char>_> comp_buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  uint64_t num_specs;
  vector<char,_std::allocator<char>_> working_space;
  string __str_2;
  ostringstream ss_e;
  string local_2b8;
  pointer *local_298;
  long local_290;
  pointer local_288 [2];
  vector<char,_std::allocator<char>_> local_278;
  undefined8 uStack_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  long *local_218 [2];
  long local_208 [2];
  vector<char,_std::allocator<char>_> local_1f8;
  long lStack_1e0;
  size_t local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar15 = this->_specs_index;
  if ((lVar15 < 0) ||
     (pSVar4 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5 <= lVar15)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x173e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar20 = "Invalid index for `SPECS` section.";
LAB_001e02b3:
    lVar15 = 0x22;
LAB_001e02b8:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,lVar15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_001e0317;
  }
  else {
    if ((this->_version[0] != '\0') || (3 < this->_version[1])) {
      pSVar5 = this->_sr;
      uVar10 = pSVar4[lVar15].start;
      if (pSVar5->length_ < uVar10) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x174c);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar20 = "Failed to move to `SPECS` section.";
        goto LAB_001e02b3;
      }
      pSVar5->idx_ = uVar10;
      bVar7 = StreamReader::read8(pSVar5,(uint64_t *)local_218);
      if (!bVar7) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1752);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar20 = "Failed to read # of specs size at `SPECS` section.";
        lVar15 = 0x32;
        goto LAB_001e02b8;
      }
      if ((long *)(this->_config).maxNumSpecifiers < local_218[0]) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1757);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar20 = "Too many specs in `SPECS` section.";
        goto LAB_001e02b3;
      }
      if (local_218[0] == (long *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x175d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        pcVar20 = "`SPECS` is empty.";
        lVar15 = 0x11;
        goto LAB_001e02b8;
      }
      uVar10 = (long)local_218[0] * 0xc + this->_memoryUsage;
      this->_memoryUsage = uVar10;
      if ((this->_config).maxMemoryBudget < uVar10) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar19 = 0x1763;
      }
      else {
        this_00 = &this->_specs;
        ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::resize
                  (this_00,(size_type)local_218[0]);
        __new_size = Usd_IntegerCompression::GetCompressedBufferSize((size_t)local_218[0]);
        uVar10 = this->_memoryUsage + __new_size;
        this->_memoryUsage = uVar10;
        if (uVar10 <= (this->_config).maxMemoryBudget) {
          local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (char *)0x0;
          local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ::std::vector<char,_std::allocator<char>_>::resize(&local_278,__new_size);
          uVar10 = (long)local_218[0] * 4 + this->_memoryUsage;
          this->_memoryUsage = uVar10;
          if ((this->_config).maxMemoryBudget < uVar10) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1772);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar7 = false;
            goto LAB_001e1210;
          }
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_258,(size_type)local_218[0],(allocator_type *)local_1a8);
          sVar12 = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize((size_t)local_218[0]);
          uVar10 = this->_memoryUsage + sVar12;
          this->_memoryUsage = uVar10;
          if ((this->_config).maxMemoryBudget < uVar10) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1779);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar7 = false;
          }
          else {
            local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<char,_std::allocator<char>_>::resize(&local_1f8,sVar12);
            bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_298);
            if (bVar7) {
              if (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start < local_298) {
                local_298 = (pointer *)
                            (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                            -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
              }
              ppuVar1 = local_298;
              pSVar5 = this->_sr;
              uVar6 = pSVar5->idx_;
              ppuVar22 = (pointer *)(pSVar5->length_ - uVar6);
              if ((long)local_298 + uVar6 <= pSVar5->length_) {
                ppuVar22 = local_298;
              }
              local_1d0 = sVar12;
              if ((pointer *)((long)ppuVar22 - 1U) < local_298) {
                memcpy(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,pSVar5->binary_ + uVar6,(size_t)ppuVar22);
                pSVar5->idx_ = (long)ppuVar22 + pSVar5->idx_;
              }
              else {
                ppuVar22 = (pointer *)0x0;
              }
              if (ppuVar1 != ppuVar22) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x178d);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                pcVar20 = "Failed to read path indexes data at `SPECS` section.";
                goto LAB_001e1155;
              }
              paVar2 = &local_2b8.field_2;
              local_2b8._M_string_length = 0;
              local_2b8.field_2._M_allocated_capacity =
                   local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_2b8._M_dataplus._M_p = (pointer)paVar2;
              sVar12 = Usd_IntegerCompression::DecompressFromBuffer
                                 (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,(size_t)local_298,
                                  local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(size_t)local_218[0],
                                  &local_2b8,
                                  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
              if (sVar12 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1795);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Failed to decode pathIndexes at `SPECS` section.",
                           0x30);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238);
                if (local_238 != &local_228) {
                  operator_delete(local_238,local_228 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
              else if (local_218[0] != (long *)0x0) {
                pSVar16 = (this_00->
                          super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                plVar9 = (long *)0x0;
                do {
                  (pSVar16->path_index).value =
                       *(uint32_t *)
                        ((long)local_258.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + (long)plVar9 * 4);
                  plVar9 = (long *)((long)plVar9 + 1);
                  pSVar16 = pSVar16 + 1;
                } while (local_218[0] != plVar9);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != paVar2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if (sVar12 == 0) goto LAB_001e11da;
              bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_298);
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17a3);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "Failed to read fieldset indexes size at `SPECS` section.",0x38);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append
                          ((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != paVar2) goto LAB_001e11ac;
                goto LAB_001e11b9;
              }
              if (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start < local_298) {
                local_298 = (pointer *)
                            (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                            -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
              }
              ppuVar1 = local_298;
              pSVar5 = this->_sr;
              uVar6 = pSVar5->idx_;
              ppuVar22 = (pointer *)(pSVar5->length_ - uVar6);
              if ((long)local_298 + uVar6 <= pSVar5->length_) {
                ppuVar22 = local_298;
              }
              if ((pointer *)((long)ppuVar22 - 1U) < local_298) {
                memcpy(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,pSVar5->binary_ + uVar6,(size_t)ppuVar22);
                pSVar5->idx_ = (long)ppuVar22 + pSVar5->idx_;
              }
              else {
                ppuVar22 = (pointer *)0x0;
              }
              if (ppuVar1 != ppuVar22) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17af);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                pcVar20 = "Failed to read fieldset indexes data at `SPECS` section.";
                lVar15 = 0x38;
                goto LAB_001e115a;
              }
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              local_2b8._M_string_length = 0;
              local_2b8.field_2._M_allocated_capacity =
                   local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              sVar12 = Usd_IntegerCompression::DecompressFromBuffer
                                 (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,(size_t)local_298,
                                  local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(size_t)local_218[0],
                                  &local_2b8,
                                  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
              if (sVar12 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17b7);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "Failed to decode fieldset indices at `SPECS` section.",0x35);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238);
                if (local_238 != &local_228) {
                  operator_delete(local_238,local_228 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
              else if (local_218[0] != (long *)0x0) {
                pIVar17 = &((this_00->
                            super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                            )._M_impl.super__Vector_impl_data._M_start)->fieldset_index;
                plVar9 = (long *)0x0;
                do {
                  pIVar17->value =
                       *(uint32_t *)
                        ((long)local_258.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + (long)plVar9 * 4);
                  plVar9 = (long *)((long)plVar9 + 1);
                  pIVar17 = pIVar17 + 3;
                } while (local_218[0] != plVar9);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if (sVar12 == 0) goto LAB_001e11da;
              bVar7 = StreamReader::read8(this->_sr,(uint64_t *)&local_298);
              if (!bVar7) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17c5);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                pcVar20 = "Failed to read spectype size at `SPECS` section.";
LAB_001e1997:
                lVar15 = 0x30;
                goto LAB_001e115a;
              }
              if (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start < local_298) {
                local_298 = (pointer *)
                            (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                            -(long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
              }
              ppuVar1 = local_298;
              pSVar5 = this->_sr;
              uVar6 = pSVar5->idx_;
              ppuVar22 = (pointer *)(pSVar5->length_ - uVar6);
              if ((long)local_298 + uVar6 <= pSVar5->length_) {
                ppuVar22 = local_298;
              }
              if ((pointer *)((long)ppuVar22 - 1U) < local_298) {
                memcpy(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,pSVar5->binary_ + uVar6,(size_t)ppuVar22);
                pSVar5->idx_ = (long)ppuVar22 + pSVar5->idx_;
              }
              else {
                ppuVar22 = (pointer *)0x0;
              }
              if (ppuVar1 != ppuVar22) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17d1);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                pcVar20 = "Failed to read spectype data at `SPECS` section.";
                goto LAB_001e1997;
              }
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              local_2b8._M_string_length = 0;
              local_2b8.field_2._M_allocated_capacity =
                   local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              sVar12 = Usd_IntegerCompression::DecompressFromBuffer
                                 (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,(size_t)local_298,
                                  local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(size_t)local_218[0],
                                  &local_2b8,
                                  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
              if (sVar12 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadSpecs",9);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x17d9);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "Failed to decode fieldset indices at `SPECS` section.\n",0x36);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238);
                if (local_238 != &local_228) {
                  operator_delete(local_238,local_228 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
              else if (local_218[0] != (long *)0x0) {
                pSVar18 = &((this_00->
                            super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                            )._M_impl.super__Vector_impl_data._M_start)->spec_type;
                plVar9 = (long *)0x0;
                do {
                  *pSVar18 = *(SpecType *)
                              ((long)local_258.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)plVar9 * 4);
                  plVar9 = (long *)((long)plVar9 + 1);
                  pSVar18 = pSVar18 + 3;
                } while (local_218[0] != plVar9);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if (sVar12 == 0) goto LAB_001e11da;
              if (this->_memoryUsage < __new_size) {
                this->_memoryUsage = this->_memoryUsage - __new_size;
              }
              if (this->_memoryUsage < local_1d0) {
                this->_memoryUsage = this->_memoryUsage - local_1d0;
              }
              bVar7 = true;
              if (this->_memoryUsage < (ulong)((long)local_218[0] * 4)) {
                this->_memoryUsage = this->_memoryUsage + (long)local_218[0] * -4;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadSpecs",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1781);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              pcVar20 = "Failed to read path indexes size at `SPECS` section.";
LAB_001e1155:
              lVar15 = 0x34;
LAB_001e115a:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar20,lVar15);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
LAB_001e11ac:
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
LAB_001e11b9:
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base(local_138);
LAB_001e11da:
              bVar7 = false;
            }
            if ((pointer *)
                local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer *)0x0) {
              operator_delete(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((pointer *)
              local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_258.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
LAB_001e1210:
          if (local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (char *)0x0) {
            return bVar7;
          }
          operator_delete(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
          return bVar7;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar19 = 0x176d;
      }
      poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,iVar19);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      pcVar20 = "Reached to max memory budget.";
      lVar15 = 0x1d;
      goto LAB_001e02b8;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadSpecs",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0x1745);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    bVar3 = this->_version[0];
    uVar23 = 1;
    if (9 < bVar3) {
      uVar23 = 3 - (bVar3 < 100);
    }
    local_218[0] = local_208;
    ::std::__cxx11::string::_M_construct((ulong)local_218,(char)uVar23);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_218[0],uVar23,(uint)bVar3);
    plVar9 = (long *)::std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x42a8d8);
    local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    plVar13 = plVar9 + 2;
    if ((pointer *)*plVar9 == (pointer *)plVar13) {
      local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar13;
      lStack_1e0 = plVar9[3];
    }
    else {
      local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar13;
      local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar9;
    }
    local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    ppuVar1 = &local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((pointer *)*plVar9 == (pointer *)puVar14) {
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar14;
      lStack_240 = plVar9[3];
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
    }
    else {
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar14;
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar9;
    }
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    bVar3 = this->_version[1];
    uVar23 = 1;
    if (9 < bVar3) {
      uVar23 = 3 - (bVar3 < 100);
    }
    local_298 = local_288;
    ::std::__cxx11::string::_M_construct((ulong)&local_298,(char)uVar23);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_298,uVar23,(uint)bVar3);
    puVar21 = (pointer)0xf;
    if ((pointer *)
        local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      puVar21 = local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (puVar21 < (pointer)(local_290 +
                           (long)local_258.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish)) {
      puVar21 = (pointer)0xf;
      if (local_298 != local_288) {
        puVar21 = local_288[0];
      }
      if (puVar21 < (pointer)(local_290 +
                             (long)local_258.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish)) goto LAB_001e073b;
      puVar11 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_298,0,(char *)0x0,
                           (ulong)local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    }
    else {
LAB_001e073b:
      puVar11 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_298)
      ;
    }
    local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    plVar9 = puVar11 + 2;
    if ((pointer *)*puVar11 == (pointer *)plVar9) {
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar9;
      uStack_260 = puVar11[3];
    }
    else {
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar9;
      local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*puVar11;
    }
    local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)puVar11[1];
    *puVar11 = plVar9;
    puVar11[1] = 0;
    *(undefined1 *)plVar9 = 0;
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_278);
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_228 = *puVar14;
      lStack_220 = plVar9[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *puVar14;
      local_238 = (ulong *)*plVar9;
    }
    local_230 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    bVar3 = this->_version[2];
    uVar23 = 1;
    if (9 < bVar3) {
      uVar23 = 3 - (bVar3 < 100);
    }
    local_1c8 = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)uVar23);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8,uVar23,(uint)bVar3);
    uVar10 = 0xf;
    if (local_238 != &local_228) {
      uVar10 = local_228;
    }
    if (uVar10 < (ulong)(local_1c0 + local_230)) {
      uVar10 = 0xf;
      if (local_1c8 != local_1b8) {
        uVar10 = local_1b8[0];
      }
      if (uVar10 < (ulong)(local_1c0 + local_230)) goto LAB_001e089e;
      puVar11 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_238);
    }
    else {
LAB_001e089e:
      puVar11 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1c8)
      ;
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    puVar14 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_2b8.field_2._M_allocated_capacity = *puVar14;
      local_2b8.field_2._8_8_ = puVar11[3];
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *puVar14;
      local_2b8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_2b8._M_string_length = puVar11[1];
    *puVar11 = puVar14;
    puVar11[1] = 0;
    *(undefined1 *)puVar14 = 0;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if ((pointer *)
        local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)(local_278.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1));
    }
    if (local_298 != local_288) {
      operator_delete(local_298,(long)local_288[0] + 1);
    }
    if ((pointer *)
        local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((pointer *)
        local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1));
    }
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_001e0317;
  }
  operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
LAB_001e0317:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadSpecs() {
  if ((_specs_index < 0) || (_specs_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `SPECS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_specs_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `SPECS` section.");
    return false;
  }

  uint64_t num_specs;
  if (!_sr->read8(&num_specs)) {
    PUSH_ERROR("Failed to read # of specs size at `SPECS` section.");
    return false;
  }

  if (num_specs > _config.maxNumSpecifiers) {
    PUSH_ERROR("Too many specs in `SPECS` section.");
    return false;
  }

  if (num_specs == 0) {
    // At least 1 Spec(Root Prim '/') must exist.
    PUSH_ERROR("`SPECS` is empty.");
    return false;
  }

  DCOUT("num_specs " << num_specs);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(Spec));

  _specs.resize(static_cast<size_t>(num_specs));

  // TODO: Memory size check

  // Create temporary space for decompressing.
  size_t compBufferSize= Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  std::vector<uint32_t> tmp(static_cast<size_t>(num_specs));

  size_t workBufferSize= Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  // path indices
  {
    uint64_t path_indexes_size;
    if (!_sr->read8(&path_indexes_size)) {
      PUSH_ERROR("Failed to read path indexes size at `SPECS` section.");
      return false;
    }

    if (path_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      path_indexes_size = comp_buffer.size();
    }

    if (path_indexes_size !=
        _sr->read(size_t(path_indexes_size), size_t(path_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read path indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(path_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode pathIndexes at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i < num_specs; ++i) {
      DCOUT("spec[" << i << "].path_index = " << tmp[i]);
      _specs[i].path_index.value = tmp[i];
    }
  }

  // fieldset indices
  {
    uint64_t fset_indexes_size;
    if (!_sr->read8(&fset_indexes_size)) {
      PUSH_ERROR("Failed to read fieldset indexes size at `SPECS` section.");
      return false;
    }

    if (fset_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      fset_indexes_size = comp_buffer.size();
    }

    if (fset_indexes_size !=
        _sr->read(size_t(fset_indexes_size), size_t(fset_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read fieldset indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(fset_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      DCOUT("specs[" << i << "].fieldset_index = " << tmp[i]);
      _specs[i].fieldset_index.value = tmp[i];
    }
  }

  // spec types
  {
    uint64_t spectype_size;
    if (!_sr->read8(&spectype_size)) {
      PUSH_ERROR("Failed to read spectype size at `SPECS` section.");
      return false;
    }

    if (spectype_size > comp_buffer.size()) {
      // Maybe corrupted?
      spectype_size = comp_buffer.size();
    }

    if (spectype_size !=
        _sr->read(size_t(spectype_size), size_t(spectype_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read spectype data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used.
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(spectype_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.\n");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      // std::cout << "spectype = " << tmp[i] << "\n";
      _specs[i].spec_type = static_cast<SpecType>(tmp[i]);
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i != num_specs; ++i) {
    DCOUT("spec[" << i << "].pathIndex  = " << _specs[i].path_index.value
                  << ", fieldset_index = " << _specs[i].fieldset_index.value
                  << ", spec_type = "
                  << tinyusdz::to_string(_specs[i].spec_type));
    if (auto specstr = GetSpecString(crate::Index(uint32_t(i)))) {
      DCOUT("spec[" << i << "] string_repr = " << specstr.value());
    }
  }
#endif

  REDUCE_MEMORY_USAGE(compBufferSize);
  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  return true;
}